

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

bool __thiscall chrono::ChSystem::DoEntireDynamics(ChSystem *this,double end_time)

{
  int iVar1;
  
  if (this->is_initialized == false) {
    SetupInitial(this);
  }
  this->applied_forces_current = false;
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3d])(this);
  DoAssembly(this,7);
  while ((this->ch_time < end_time &&
         (iVar1 = (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x43])
                            (this), (char)iVar1 != '\0'))) {
    if (this->last_err != false) {
      return false;
    }
  }
  return (bool)(this->last_err ^ 1);
}

Assistant:

bool ChSystem::DoEntireDynamics(double end_time) {
    if (!is_initialized)
        SetupInitial();

    applied_forces_current = false;

    Setup();

    // the system may have wrong layout, or too large
    // clearances in constraints, so it is better to
    // check for constraint violation each time the integration starts
    DoAssembly(AssemblyLevel::POSITION | AssemblyLevel::VELOCITY | AssemblyLevel::ACCELERATION);

    // Perform the integration steps until the end
    // time is reached.
    // All the updating (of Y, Y_dt and time) is done
    // automatically by Integrate()

    while (ch_time < end_time) {
        if (!Integrate_Y())
            break;  // >>> 1- single integration step,
                    //        updating Y, from t to t+dt.
        if (last_err)
            return false;
    }

    if (last_err)
        return false;
    return true;
}